

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m2v.c
# Opt level: O0

void m2v_copy_col(m2v *M1,int c1,m2v *Mt,int ct)

{
  uint uVar1;
  m2v_base *pmVar2;
  int iVar3;
  m2v_base mVar4;
  m2v_base mVar5;
  uint *puVar6;
  int in_ECX;
  m2v *in_RDX;
  int in_ESI;
  m2v *in_RDI;
  m2v_base *p;
  m2v_base w1;
  int i;
  m2v_base mt;
  m2v_base m1;
  int local_28;
  
  iVar3 = m2v__get_bit(in_RDI,in_ESI);
  mVar4 = m2v__get_mask(iVar3);
  iVar3 = m2v__get_bit(in_RDX,in_ECX);
  mVar5 = m2v__get_mask(iVar3);
  for (local_28 = 0; local_28 < in_RDI->n_row; local_28 = local_28 + 1) {
    pmVar2 = in_RDI->e;
    iVar3 = m2v__get_word(in_RDI,local_28,in_ESI);
    uVar1 = pmVar2[iVar3];
    pmVar2 = in_RDX->e;
    iVar3 = m2v__get_word(in_RDX,local_28,in_ECX);
    puVar6 = pmVar2 + iVar3;
    if ((uVar1 & mVar4) == 0) {
      *puVar6 = (mVar5 ^ 0xffffffff) & *puVar6;
    }
    else {
      *puVar6 = mVar5 | *puVar6;
    }
  }
  return;
}

Assistant:

void m2v_copy_col(const m2v* M1,
			int c1,
			m2v* Mt,
			int ct)
{
	assert(M1->n_row == Mt->n_row);
	assert(0 <= c1 && c1 < M1->n_col);
	assert(0 <= ct && ct < Mt->n_col);

	const m2v_base m1 = get_mask(get_bit(M1, c1));
	const m2v_base mt = get_mask(get_bit(Mt, ct));
	for (int i = 0; i < M1->n_row; ++i) {
		const m2v_base w1 = M1->e[get_word(M1, i, c1)];
		m2v_base* p = &Mt->e[get_word(Mt, i, ct)];
		if (w1 & m1) {
			*p |= mt;
		} else {
			*p &= ~mt;
		}
	}
}